

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest17::getGeometryShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest17 *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nsubroutine void subroutineTypeGS(out vec4 result);\n\nsubroutine(subroutineTypeGS) void subroutine1(out vec4 result)\n{\n    result = vec4(4, 5, 6, 7);\n}\n\nsubroutine uniform subroutineTypeGS function;\n\nin TE_DATA\n{\n    vec4 tc_data;\n    vec4 te_data;\n    vec4 vs_data;\n} te[];\n\nout GS_DATA\n{\n    vec4 gs_data;\n    vec4 tc_data;\n    vec4 te_data;\n    vec4 vs_data;\n} result;\n\nvoid main()\n{\n    function(result.gs_data);\n    gl_Position    = vec4(1, -1, 0, 1);\n    result.tc_data = te[0].tc_data;\n    result.te_data = te[0].te_data;\n    result.vs_data = te[0].vs_data;\n    EmitVertex();\n\n    function(result.gs_data);\n    gl_Position    = vec4(-1, -1, 0, 1);\n    result.tc_data = te[0].tc_data;\n    result.te_data = te[0].te_data;\n    result.vs_data = te[0].vs_data;\n    EmitVertex();\n\n    function(result.gs_data);\n    gl_Position    = vec4(1, 1, 0, 1);\n    result.tc_data = te[0].tc_data;\n    result.te_data = te[0].te_data;\n    result.vs_data = te[0].vs_data;\n    EmitVertex();\n\n    function(result.gs_data);\n    gl_Position    = vec4(-1, 1, 0, 1);\n    result.tc_data = te[0].tc_data;\n    result.te_data = te[0].te_data;\n    result.vs_data = te[0].vs_data;\n    EmitVertex();\n    EndPrimitive();\n}\n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest17::getGeometryShaderBody() const
{
	return "#version 400\n"
		   "\n"
		   "#extension GL_ARB_shader_subroutine : require\n"
		   "\n"
		   "layout(points)                           in;\n"
		   "layout(triangle_strip, max_vertices = 4) out;\n"
		   "\n"
		   "subroutine void subroutineTypeGS(out vec4 result);\n"
		   "\n"
		   "subroutine(subroutineTypeGS) void subroutine1(out vec4 result)\n"
		   "{\n"
		   "    result = vec4(4, 5, 6, 7);\n"
		   "}\n"
		   "\n"
		   "subroutine uniform subroutineTypeGS function;\n"
		   "\n"
		   "in TE_DATA\n"
		   "{\n"
		   "    vec4 tc_data;\n"
		   "    vec4 te_data;\n"
		   "    vec4 vs_data;\n"
		   "} te[];\n"
		   "\n"
		   "out GS_DATA\n"
		   "{\n"
		   "    vec4 gs_data;\n"
		   "    vec4 tc_data;\n"
		   "    vec4 te_data;\n"
		   "    vec4 vs_data;\n"
		   "} result;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    function(result.gs_data);\n"
		   "    gl_Position    = vec4(1, -1, 0, 1);\n"
		   "    result.tc_data = te[0].tc_data;\n"
		   "    result.te_data = te[0].te_data;\n"
		   "    result.vs_data = te[0].vs_data;\n"
		   "    EmitVertex();\n"
		   "\n"
		   "    function(result.gs_data);\n"
		   "    gl_Position    = vec4(-1, -1, 0, 1);\n"
		   "    result.tc_data = te[0].tc_data;\n"
		   "    result.te_data = te[0].te_data;\n"
		   "    result.vs_data = te[0].vs_data;\n"
		   "    EmitVertex();\n"
		   "\n"
		   "    function(result.gs_data);\n"
		   "    gl_Position    = vec4(1, 1, 0, 1);\n"
		   "    result.tc_data = te[0].tc_data;\n"
		   "    result.te_data = te[0].te_data;\n"
		   "    result.vs_data = te[0].vs_data;\n"
		   "    EmitVertex();\n"
		   "\n"
		   "    function(result.gs_data);\n"
		   "    gl_Position    = vec4(-1, 1, 0, 1);\n"
		   "    result.tc_data = te[0].tc_data;\n"
		   "    result.te_data = te[0].te_data;\n"
		   "    result.vs_data = te[0].vs_data;\n"
		   "    EmitVertex();\n"
		   "    EndPrimitive();\n"
		   "}\n";
}